

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

QChar * QUtf16::convertToUnicode(QChar *out,QByteArrayView in,State *state,DataEndianness endian)

{
  bool bVar1;
  qsizetype qVar2;
  uchar *puVar3;
  QChar *pQVar4;
  long in_RCX;
  uchar *puVar5;
  SpecialCharacter ch_00;
  QChar *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  bool bVar6;
  qsizetype nPairs;
  uchar buf;
  bool headerdone;
  char *end;
  char *chars;
  qsizetype len;
  QChar ch;
  QChar *in_stack_ffffffffffffff68;
  Flag other;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  uchar local_72;
  uchar *local_68;
  int local_54;
  QChar *local_48;
  QChar *local_40;
  QFlagsStorageHelper<QStringConverterBase::Flag,_4> local_34;
  QChar local_2e;
  QFlagsStorageHelper<QStringConverterBase::Flag,_4> local_2c;
  QChar local_26;
  char16_t local_24;
  QChar local_22;
  QChar local_20;
  QChar local_1e;
  QFlagsStorageHelper<QStringConverterBase::Flag,_4> local_1c;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QByteArrayView::size(&local_18);
  puVar3 = (uchar *)QByteArrayView::data(&local_18);
  local_54 = in_R8D;
  if (in_R8D == 0) {
    local_54 = *(int *)(in_RCX + 0x18);
  }
  if (*(long *)(in_RCX + 8) + qVar2 < 2) {
    local_40 = in_RDI;
    if (qVar2 != 0) {
      *(undefined8 *)(in_RCX + 8) = 1;
      *(int *)(in_RCX + 0x1c) = (int)(char)*puVar3;
    }
  }
  else {
    bVar6 = false;
    if (in_RCX != 0) {
      bVar6 = (*(uint *)(in_RCX + 4) & 1) != 0;
    }
    local_1c.super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorage<QStringConverterBase::Flag>)
         QFlags<QStringConverterBase::Flag>::operator&
                   ((QFlags<QStringConverterBase::Flag> *)
                    CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                    (Flag)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1c);
    if (bVar1) {
      bVar6 = true;
    }
    local_68 = puVar3;
    local_48 = in_RDI;
    if ((bVar6) && (*(long *)(in_RCX + 8) == 0)) {
      if (local_54 == 0) {
        local_54 = 2;
      }
    }
    else {
      if (*(long *)(in_RCX + 8) == 0) {
        local_68 = puVar3 + 1;
        local_72 = *puVar3;
      }
      else {
        local_72 = (uchar)*(undefined4 *)(in_RCX + 0x1c);
      }
      *(uint *)(in_RCX + 4) = *(uint *)(in_RCX + 4) | 1;
      local_1e.ucs = L'ꪪ';
      puVar5 = local_68 + 1;
      QChar::QChar(&local_1e,local_72,*local_68);
      if (local_54 == 0) {
        QChar::QChar<QChar::SpecialCharacter,_true>(&local_20,ByteOrderSwapped);
        bVar1 = ::operator==((QChar *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                             in_stack_ffffffffffffff68);
        if (bVar1) {
          local_54 = 1;
        }
        else {
          QChar::QChar<QChar::SpecialCharacter,_true>(&local_22,ByteOrderMark);
          ::operator==((QChar *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68);
          local_54 = 2;
        }
      }
      if (local_54 == 1) {
        QChar::unicode(&local_1e);
        QChar::unicode(&local_1e);
        local_24 = (char16_t)QChar::fromUcs2((char16_t)((ulong)in_stack_ffffffffffffff68 >> 0x20));
        local_1e = (QChar)local_24;
      }
      in_stack_ffffffffffffff77 = true;
      if (!bVar6) {
        QChar::QChar<QChar::SpecialCharacter,_true>(&local_26,ByteOrderMark);
        in_stack_ffffffffffffff77 =
             ::operator!=((QChar *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                          in_stack_ffffffffffffff68);
      }
      local_68 = puVar5;
      if ((bool)in_stack_ffffffffffffff77 != false) {
        local_48 = in_RDI + 1;
        in_RDI->ucs = local_1e.ucs;
      }
    }
    if (local_54 == 1) {
      qFromBigEndian<char16_t>
                ((void *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 (qsizetype)in_stack_ffffffffffffff68,(void *)0x542f8f);
      other = (Flag)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    }
    else {
      qFromLittleEndian<char16_t>
                ((void *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 (qsizetype)in_stack_ffffffffffffff68,(void *)0x542fa5);
      other = (Flag)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    }
    pQVar4 = local_48 + ((long)(puVar3 + (qVar2 - (long)local_68)) >> 1);
    *(int *)(in_RCX + 0x18) = local_54;
    *(undefined8 *)(in_RCX + 8) = 0;
    local_48 = pQVar4;
    if (((ulong)(puVar3 + (qVar2 - (long)local_68)) & 1) == 0) {
      *(undefined4 *)(in_RCX + 0x1c) = 0;
    }
    else {
      local_2c.super_QFlagsStorage<QStringConverterBase::Flag>.i =
           (QFlagsStorage<QStringConverterBase::Flag>)
           QFlags<QStringConverterBase::Flag>::operator&
                     ((QFlags<QStringConverterBase::Flag> *)
                      CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),other);
      bVar6 = ::QFlags::operator_cast_to_bool((QFlags *)&local_2c);
      if (bVar6) {
        local_34.super_QFlagsStorage<QStringConverterBase::Flag>.i =
             (QFlagsStorage<QStringConverterBase::Flag>)
             QFlags<QStringConverterBase::Flag>::operator&
                       ((QFlags<QStringConverterBase::Flag> *)
                        CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),other);
        bVar6 = ::QFlags::operator_cast_to_bool((QFlags *)&local_34);
        ch_00 = ReplacementCharacter;
        if (bVar6) {
          ch_00 = Null;
        }
        QChar::QChar<QChar::SpecialCharacter,_true>(&local_2e,ch_00);
        local_48 = pQVar4 + 1;
        pQVar4->ucs = local_2e.ucs;
      }
      else {
        *(undefined8 *)(in_RCX + 8) = 1;
        *(int *)(in_RCX + 0x1c) = (int)(char)puVar3[qVar2 + -1];
      }
    }
    local_40 = local_48;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

QChar *QUtf16::convertToUnicode(QChar *out, QByteArrayView in, QStringConverter::State *state, DataEndianness endian)
{
    qsizetype len = in.size();
    const char *chars = in.data();

    Q_ASSERT(state);

    if (endian == DetectEndianness)
        endian = (DataEndianness)state->state_data[Endian];

    const char *end = chars + len;

    // make sure we can decode at least one char
    if (state->remainingChars + len < 2) {
        if (len) {
            Q_ASSERT(state->remainingChars == 0 && len == 1);
            state->remainingChars = 1;
            state->state_data[Data] = *chars;
        }
        return out;
    }

    bool headerdone = state && state->internalState & HeaderDone;
    if (state->flags & QStringConverter::Flag::ConvertInitialBom)
        headerdone = true;

    if (!headerdone || state->remainingChars) {
        uchar buf;
        if (state->remainingChars)
            buf = state->state_data[Data];
        else
            buf = *chars++;

        // detect BOM, set endianness
        state->internalState |= HeaderDone;
        QChar ch(buf, *chars++);
        if (endian == DetectEndianness) {
            // someone set us up the BOM
            if (ch == QChar::ByteOrderSwapped) {
                endian = BigEndianness;
            } else if (ch == QChar::ByteOrderMark) {
                endian = LittleEndianness;
            } else {
                if (QSysInfo::ByteOrder == QSysInfo::BigEndian) {
                    endian = BigEndianness;
                } else {
                    endian = LittleEndianness;
                }
            }
        }
        if (endian == BigEndianness)
            ch = QChar::fromUcs2((ch.unicode() >> 8) | ((ch.unicode() & 0xff) << 8));
        if (headerdone || ch != QChar::ByteOrderMark)
            *out++ = ch;
    } else if (endian == DetectEndianness) {
        endian = (QSysInfo::ByteOrder == QSysInfo::BigEndian) ? BigEndianness : LittleEndianness;
    }

    qsizetype nPairs = (end - chars) >> 1;
    if (endian == BigEndianness)
        qFromBigEndian<char16_t>(chars, nPairs, out);
    else
        qFromLittleEndian<char16_t>(chars, nPairs, out);
    out += nPairs;

    state->state_data[Endian] = endian;
    state->remainingChars = 0;
    if ((end - chars) & 1) {
        if (state->flags & QStringConverter::Flag::Stateless) {
            *out++ = state->flags & QStringConverter::Flag::ConvertInvalidToNull ? QChar::Null : QChar::ReplacementCharacter;
        } else {
            state->remainingChars = 1;
            state->state_data[Data] = *(end - 1);
        }
    } else {
        state->state_data[Data] = 0;
    }

    return out;
}